

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall AddrManImpl::ClearNew(AddrManImpl *this,int nUBucket,int nUBucketPos)

{
  int iVar1;
  string_view source_file;
  bool bVar2;
  mapped_type *this_00;
  Logger *pLVar3;
  int *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nIdDelete;
  string log_msg;
  int local_108;
  int local_104;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [7];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->vvNew[nUBucket][nUBucketPos];
  local_104 = nUBucketPos;
  local_100._0_4_ = nUBucket;
  if (iVar1 != -1) {
    local_108 = iVar1;
    this_00 = std::__detail::
              _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->mapInfo,&local_108);
    if (this_00->nRefCount < 1) {
      __assert_fail("infoDelete.nRefCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                    ,0x1e1,"void AddrManImpl::ClearNew(int, int)");
    }
    this_00->nRefCount = this_00->nRefCount + -1;
    this->vvNew[(int)local_100._0_4_][local_104] = -1;
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,ADDRMAN,Debug);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)(local_100 + 8),(CService *)this_00);
      pLVar3 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar3);
      if (bVar2) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<std::__cxx11::string,int,int>
                  (&local_78,(tinyformat *)"Removed %s from new[%i][%i]\n",local_100 + 8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &local_104,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar3 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x54;
        local_78._M_string_length = 0xfba758;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
        source_file._M_len = 0x54;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "ClearNew";
        logging_function._M_len = 8;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x1e4,ADDRMAN,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._8_8_ != local_e8) {
        operator_delete((void *)local_100._8_8_,local_e8[0]._M_allocated_capacity + 1);
      }
    }
    if (this_00->nRefCount == 0) {
      Delete(this,local_108);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::ClearNew(int nUBucket, int nUBucketPos)
{
    AssertLockHeld(cs);

    // if there is an entry in the specified bucket, delete it.
    if (vvNew[nUBucket][nUBucketPos] != -1) {
        int nIdDelete = vvNew[nUBucket][nUBucketPos];
        AddrInfo& infoDelete = mapInfo[nIdDelete];
        assert(infoDelete.nRefCount > 0);
        infoDelete.nRefCount--;
        vvNew[nUBucket][nUBucketPos] = -1;
        LogDebug(BCLog::ADDRMAN, "Removed %s from new[%i][%i]\n", infoDelete.ToStringAddrPort(), nUBucket, nUBucketPos);
        if (infoDelete.nRefCount == 0) {
            Delete(nIdDelete);
        }
    }
}